

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t buf_size;
  char *pcVar8;
  ImDrawList *this;
  ImGuiTabItem *tab_00;
  char *in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiTabItem *tab_1;
  int tab_n_1;
  ImDrawList *draw_list;
  bool open;
  ImGuiTabItem *tab;
  int tab_n;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [256];
  int in_stack_fffffffffffffe44;
  uint in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe56;
  char in_stack_fffffffffffffe57;
  ImVec4 *in_stack_fffffffffffffe58;
  ImGuiHoveredFlags flags;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar9;
  ImVec2 in_stack_fffffffffffffe98;
  ImVec2 in_stack_fffffffffffffea0;
  ImVec2 local_158;
  ImVec2 local_150;
  ImDrawList *local_148;
  float in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint uVar10;
  ImGuiTabItem *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed4;
  ImVec2 *p_min;
  char *pcVar11;
  char local_118 [24];
  ImVec2 IStack_18;
  char *local_10;
  ImGuiTabBar *local_8;
  
  pcVar7 = local_118;
  p_min = &IStack_18;
  iVar3 = in_RDI->PrevFrameVisible;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = GetFrameCount();
  bVar1 = iVar2 + -2 <= iVar3;
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
  pcVar6 = " *Inactive*";
  if (bVar1) {
    pcVar6 = "";
  }
  iVar3 = ImFormatString(pcVar7,(long)p_min - (long)pcVar7,"%s 0x%08X (%d tabs)%s  {",local_10,
                         (ulong)local_8->ID,(ulong)(uint)(local_8->Tabs).Size,pcVar6);
  pcVar7 = pcVar7 + iVar3;
  iVar3 = 0;
  while (iVar2 = iVar3, iVar4 = ImMin<int>((local_8->Tabs).Size,3), iVar3 < iVar4) {
    in_stack_fffffffffffffec8 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,iVar2);
    buf_size = (long)p_min - (long)pcVar7;
    pcVar6 = "";
    if (0 < iVar2) {
      pcVar6 = ", ";
    }
    pcVar11 = pcVar7;
    pcVar8 = TabBarGetTabName(local_8,in_stack_fffffffffffffec8);
    iVar3 = ImFormatString(pcVar7,buf_size,"%s\'%s\'",pcVar6,pcVar8);
    pcVar7 = pcVar11 + iVar3;
    iVar3 = iVar2 + 1;
  }
  pcVar6 = " } ";
  if (3 < (local_8->Tabs).Size) {
    pcVar6 = " ... }";
  }
  iVar3 = ImFormatString(pcVar7,(long)p_min - (long)pcVar7,pcVar6);
  this = (ImDrawList *)(pcVar7 + iVar3);
  if ((uVar9 & 0x1000000) == 0) {
    GetStyleColorVec4(1);
    PushStyleColor((ImGuiCol)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
  }
  flags = (ImGuiHoveredFlags)in_stack_fffffffffffffe60;
  bVar1 = TreeNode(local_10,"%s",local_118);
  uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec4);
  if ((uVar9 & 0x1000000) == 0) {
    PopStyleColor(in_stack_fffffffffffffe44);
  }
  if (((uVar9 & 0x1000000) != 0) && (bVar1 = IsItemHovered(flags), bVar1)) {
    local_148 = GetForegroundDrawList();
    ImDrawList::AddRect(this,p_min,(ImVec2 *)CONCAT44(uVar9,iVar2),
                        (ImU32)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                        SUB84(in_stack_fffffffffffffec8,0),uVar10,in_stack_fffffffffffffec0);
    ImVec2::ImVec2(&local_150,local_8->ScrollingRectMinX,(local_8->BarRect).Min.y);
    ImVec2::ImVec2(&local_158,local_8->ScrollingRectMinX,(local_8->BarRect).Max.y);
    ImDrawList::AddLine((ImDrawList *)in_stack_fffffffffffffea0,(ImVec2 *)in_stack_fffffffffffffe98,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (ImU32)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                        (float)in_stack_fffffffffffffe88);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea0,local_8->ScrollingRectMaxX,
                   (local_8->BarRect).Min.y);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe98,local_8->ScrollingRectMaxX,
                   (local_8->BarRect).Max.y);
    ImDrawList::AddLine((ImDrawList *)in_stack_fffffffffffffea0,(ImVec2 *)in_stack_fffffffffffffe98,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (ImU32)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                        (float)in_stack_fffffffffffffe88);
  }
  if ((uVar10 & 0x1000000) != 0) {
    for (uVar9 = 0; (int)uVar9 < (local_8->Tabs).Size; uVar9 = uVar9 + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,uVar9);
      PushID((void *)CONCAT17(in_stack_fffffffffffffe57,
                              CONCAT16(in_stack_fffffffffffffe56,
                                       CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                                      )));
      bVar1 = SmallButton((char *)CONCAT17(in_stack_fffffffffffffe57,
                                           CONCAT16(in_stack_fffffffffffffe56,
                                                    CONCAT24(in_stack_fffffffffffffe54,
                                                             in_stack_fffffffffffffe50))));
      if (bVar1) {
        TabBarQueueReorder(local_8,tab_00,-1);
      }
      SameLine(0.0,2.0);
      bVar1 = SmallButton((char *)CONCAT17(in_stack_fffffffffffffe57,
                                           CONCAT16(in_stack_fffffffffffffe56,
                                                    CONCAT24(in_stack_fffffffffffffe54,
                                                             in_stack_fffffffffffffe50))));
      in_stack_fffffffffffffe50 = uVar9;
      if (bVar1) {
        TabBarQueueReorder(local_8,tab_00,1);
        in_stack_fffffffffffffe50 = uVar9;
      }
      SameLine(0.0,-1.0);
      in_stack_fffffffffffffe56 = 0x20;
      in_stack_fffffffffffffe57 = '*';
      if (tab_00->ID != local_8->SelectedTabId) {
        in_stack_fffffffffffffe57 = ' ';
      }
      uVar5 = (uint)in_stack_fffffffffffffe57;
      uVar10 = tab_00->ID;
      uVar9 = in_stack_fffffffffffffe50;
      pcVar7 = TabBarGetTabName(local_8,tab_00);
      Text((char *)(double)tab_00->Offset,(double)tab_00->Width,(double)tab_00->ContentWidth,
           "%02d%c Tab 0x%08X \'%s\' Offset: %.2f, Width: %.2f/%.2f",
           (ulong)in_stack_fffffffffffffe50,(ulong)uVar5,(ulong)uVar10,pcVar7);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s  {", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'", tab_n > 0 ? ", " : "", TabBarGetTabName(tab_bar, tab));
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.2f, Width: %.2f/%.2f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, TabBarGetTabName(tab_bar, tab), tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}